

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
o4_roots<float>(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
               Matrix<float,_5,_1,_0,_5,_1> *p)

{
  double dVar1;
  double dVar2;
  __type _Var3;
  CoeffReturnType pfVar4;
  complex<double> *pcVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined8 uVar6;
  double dVar7;
  float local_59c;
  double local_598;
  complex<double> local_590;
  double local_580;
  complex<double> local_578;
  double local_568;
  complex<double> local_560;
  complex<double> local_550;
  complex<double> local_540;
  complex<double> local_530;
  undefined1 local_520 [16];
  complex<double> local_510;
  double local_500;
  complex<double> local_4f8;
  double local_4e8 [3];
  float local_4cc;
  double local_4c8;
  complex<double> local_4c0;
  double local_4b0;
  complex<double> local_4a8;
  double local_498;
  complex<double> local_490;
  complex<double> local_480;
  complex<double> local_470;
  complex<double> local_460;
  undefined1 local_450 [16];
  complex<double> local_440;
  double local_430;
  complex<double> local_428;
  double local_418 [3];
  float local_3fc;
  double local_3f8;
  complex<double> local_3f0;
  double local_3e0;
  complex<double> local_3d8;
  double local_3c8;
  complex<double> local_3c0;
  complex<double> local_3b0;
  complex<double> local_3a0;
  complex<double> local_390;
  complex<double> local_380;
  double local_370;
  complex<double> local_368;
  double local_358 [3];
  float local_33c;
  double local_338;
  complex<double> local_330;
  double local_320;
  complex<double> local_318;
  double local_308;
  complex<double> local_300;
  complex<double> local_2f0;
  complex<double> local_2e0;
  complex<double> local_2d0;
  complex<double> local_2c0;
  double local_2b0;
  complex<double> local_2a8;
  double local_298 [3];
  double local_280;
  complex<double> local_278;
  complex<double> local_268;
  undefined1 local_258 [8];
  complex<double> w;
  complex<double> local_240;
  complex<double> local_230;
  double local_220;
  complex<double> local_218 [2];
  double local_1f8;
  complex<double> local_1f0;
  double local_1e0 [3];
  undefined1 local_1c8 [8];
  complex<double> y;
  undefined1 local_1b0 [8];
  complex<double> U;
  double local_198;
  complex<double> local_190;
  complex<double> local_180;
  double local_170;
  double local_168;
  complex<double> local_160;
  complex<double> local_150;
  complex<double> local_140;
  complex<double> local_130;
  double local_120;
  complex<double> local_118;
  complex<double> local_108;
  undefined1 local_f8 [8];
  complex<double> R;
  complex<double> Q;
  complex<double> P;
  double alpha_pw3;
  double alpha_pw2;
  double gamma;
  double beta;
  double alpha;
  double B_pw4;
  double A_pw4;
  double B_pw3;
  double A_pw3;
  double B_pw2;
  double A_pw2;
  double E;
  double D;
  double C;
  double B;
  double A;
  undefined1 auStack_38 [8];
  complex<double> temp;
  Matrix<float,_5,_1,_0,_5,_1> *p_local;
  vector<float,_std::allocator<float>_> *realRoots;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  std::complex<double>::complex((complex<double> *)auStack_38,0.0,0.0);
  pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0> *)p,0,0);
  B = (double)*pfVar4;
  pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0> *)p,1,0);
  C = (double)*pfVar4;
  pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0> *)p,2,0);
  D = (double)*pfVar4;
  pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0> *)p,3,0);
  E = (double)*pfVar4;
  pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_0> *)p,4,0);
  A_pw2 = (double)*pfVar4;
  B_pw2 = B * B;
  A_pw3 = C * C;
  B_pw3 = B_pw2 * B;
  A_pw4 = A_pw3 * C;
  B_pw4 = B_pw3 * B;
  alpha = A_pw4 * C;
  beta = (A_pw3 * -3.0) / (B_pw2 * 8.0) + D / B;
  dVar1 = (A_pw4 / (B_pw3 * 8.0) - (C * D) / (B_pw2 + B_pw2)) + E / B;
  dVar7 = (alpha * -3.0) / (B_pw4 * 256.0) + (A_pw3 * D) / (B_pw3 * 16.0) + (C * E) / (B_pw2 * -4.0)
          + A_pw2 / B;
  dVar2 = beta * beta * beta;
  std::complex<double>::complex
            ((complex<double> *)(Q._M_value + 8),(beta * beta) / -12.0 - dVar7,0.0);
  dVar7 = beta * dVar7;
  _Var3 = std::pow<double,int>(dVar1,2);
  uVar6 = 0;
  std::complex<double>::complex
            ((complex<double> *)(R._M_value + 8),dVar7 / 3.0 + dVar2 / -108.0 + _Var3 * -0.125,0.0);
  std::operator-((complex<double> *)(R._M_value + 8));
  local_120 = 2.0;
  local_118._M_value._8_8_ = uVar6;
  std::operator/(&local_118,&local_120);
  local_168 = 2.0;
  std::pow<double>((complex<double> *)(R._M_value + 8),&local_168);
  local_170 = 4.0;
  std::operator/(&local_160,&local_170);
  local_198 = 3.0;
  std::pow<double>((complex<double> *)(Q._M_value + 8),&local_198);
  U._M_value._8_8_ = 0x403b000000000000;
  std::operator/(&local_190,(double *)(U._M_value + 8));
  std::operator+(&local_150,&local_180);
  std::sqrt<double>(&local_140);
  std::operator+(&local_108,&local_130);
  y._M_value._8_8_ = 0x3fd5555555555555;
  std::pow<double>((complex<double> *)local_f8,(double *)(y._M_value + 8));
  std::complex<double>::complex((complex<double> *)local_1c8,0.0,0.0);
  dVar7 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_1b0);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    uVar6 = 0x4018000000000000;
    local_220 = (beta * -5.0) / 6.0;
    w._M_value._8_8_ = 0x4008000000000000;
    std::operator*((double *)(w._M_value + 8),(complex<double> *)local_1b0);
    local_240._M_value._8_8_ = uVar6;
    std::operator/((complex<double> *)(Q._M_value + 8),&local_240);
    std::operator-(&local_220,&local_230);
    std::operator+(local_218,(complex<double> *)local_1b0);
  }
  else {
    uVar6 = 0x4018000000000000;
    local_1e0[0] = (beta * -5.0) / 6.0;
    local_1f8 = 0.3333333333333333;
    std::pow<double>((complex<double> *)(R._M_value + 8),&local_1f8);
    local_1f0._M_value._8_8_ = uVar6;
    std::operator-(local_1e0,&local_1f0);
  }
  local_280 = 2.0;
  std::operator*(&local_280,(complex<double> *)local_1c8);
  std::operator+(&beta,&local_278);
  std::sqrt<double>(&local_268);
  local_298[0] = (double)(float)C / (B * -4.0);
  local_2b0 = 0.5;
  uVar6 = 0x4008000000000000;
  local_308 = beta * 3.0;
  local_320 = 2.0;
  std::operator*(&local_320,(complex<double> *)local_1c8);
  local_318._M_value._8_8_ = uVar6;
  std::operator+(&local_308,&local_318);
  local_338 = dVar1 + dVar1;
  std::operator/(&local_338,(complex<double> *)local_258);
  std::operator+(&local_300,&local_330);
  std::operator-(&local_2f0);
  std::sqrt<double>(&local_2e0);
  std::operator+((complex<double> *)local_258,&local_2d0);
  std::operator*(&local_2b0,&local_2c0);
  std::operator+(local_298,&local_2a8);
  pcVar5 = (complex<double> *)auStack_38;
  std::complex<double>::imag_abi_cxx11_(pcVar5);
  std::abs((int)pcVar5);
  if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 1e-06) {
    dVar7 = std::complex<double>::real_abi_cxx11_((complex<double> *)auStack_38);
    local_33c = (float)dVar7;
    std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,&local_33c);
  }
  local_358[0] = (double)(float)C / (B * -4.0);
  local_370 = 0.5;
  uVar6 = 0x4008000000000000;
  local_3c8 = beta * 3.0;
  local_3e0 = 2.0;
  std::operator*(&local_3e0,(complex<double> *)local_1c8);
  local_3d8._M_value._8_8_ = uVar6;
  std::operator+(&local_3c8,&local_3d8);
  local_3f8 = dVar1 + dVar1;
  std::operator/(&local_3f8,(complex<double> *)local_258);
  std::operator+(&local_3c0,&local_3f0);
  std::operator-(&local_3b0);
  std::sqrt<double>(&local_3a0);
  std::operator-((complex<double> *)local_258,&local_390);
  std::operator*(&local_370,&local_380);
  std::operator+(local_358,&local_368);
  pcVar5 = (complex<double> *)auStack_38;
  std::complex<double>::imag_abi_cxx11_(pcVar5);
  std::abs((int)pcVar5);
  if ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) < 1e-06) {
    dVar7 = std::complex<double>::real_abi_cxx11_((complex<double> *)auStack_38);
    local_3fc = (float)dVar7;
    std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,&local_3fc);
  }
  dVar7 = B * -4.0;
  local_418[0] = (double)(float)C / dVar7;
  local_430 = 0.5;
  std::operator-((complex<double> *)local_258);
  uVar6 = 0x4008000000000000;
  local_498 = beta * 3.0;
  local_4b0 = 2.0;
  local_450._8_8_ = dVar7;
  std::operator*(&local_4b0,(complex<double> *)local_1c8);
  local_4a8._M_value._8_8_ = uVar6;
  std::operator+(&local_498,&local_4a8);
  local_4c8 = dVar1 + dVar1;
  std::operator/(&local_4c8,(complex<double> *)local_258);
  std::operator-(&local_490,&local_4c0);
  std::operator-(&local_480);
  std::sqrt<double>(&local_470);
  std::operator+((complex<double> *)local_450,&local_460);
  std::operator*(&local_430,&local_440);
  std::operator+(local_418,&local_428);
  pcVar5 = (complex<double> *)auStack_38;
  std::complex<double>::imag_abi_cxx11_(pcVar5);
  std::abs((int)pcVar5);
  if ((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) < 1e-06) {
    dVar7 = std::complex<double>::real_abi_cxx11_((complex<double> *)auStack_38);
    local_4cc = (float)dVar7;
    std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,&local_4cc);
  }
  dVar7 = B * -4.0;
  local_4e8[0] = (double)(float)C / dVar7;
  local_500 = 0.5;
  std::operator-((complex<double> *)local_258);
  uVar6 = 0x4008000000000000;
  local_568 = beta * 3.0;
  local_580 = 2.0;
  local_520._8_8_ = dVar7;
  std::operator*(&local_580,(complex<double> *)local_1c8);
  local_578._M_value._8_8_ = uVar6;
  std::operator+(&local_568,&local_578);
  local_598 = dVar1 + dVar1;
  std::operator/(&local_598,(complex<double> *)local_258);
  std::operator-(&local_560,&local_590);
  std::operator-(&local_550);
  std::sqrt<double>(&local_540);
  std::operator-((complex<double> *)local_520,&local_530);
  std::operator*(&local_500,&local_510);
  std::operator+(local_4e8,&local_4f8);
  pcVar5 = (complex<double> *)auStack_38;
  std::complex<double>::imag_abi_cxx11_(pcVar5);
  std::abs((int)pcVar5);
  if ((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02) < 1e-06) {
    dVar1 = std::complex<double>::real_abi_cxx11_((complex<double> *)auStack_38);
    local_59c = (float)dVar1;
    std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,&local_59c);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<floatPrec> o4_roots(const Matrix<floatPrec, 5, 1> &p)
{

  vector<floatPrec> realRoots;
  complex<double> temp;

  double A = (double)p(0, 0);
  double B = (double)p(1, 0);
  double C = (double)p(2, 0);
  double D = (double)p(3, 0);
  double E = (double)p(4, 0);

  double A_pw2 = A * A;
  double B_pw2 = B * B;
  double A_pw3 = A_pw2 * A;
  double B_pw3 = B_pw2 * B;
  double A_pw4 = A_pw3 * A;
  double B_pw4 = B_pw3 * B;

  double alpha = -3 * B_pw2 / (8 * A_pw2) + C / A;
  double beta = B_pw3 / (8 * A_pw3) - B * C / (2 * A_pw2) + D / A;
  double gamma = -3 * B_pw4 / (256 * A_pw4) + B_pw2 * C / (16 * A_pw3) - B * D / (4 * A_pw2) + E / A;

  double alpha_pw2 = alpha * alpha;
  double alpha_pw3 = alpha_pw2 * alpha;

  complex<double> P(-alpha_pw2 / 12.0 - gamma, 0);
  complex<double> Q(-alpha_pw3 / 108.0 + alpha * gamma / 3 - pow(beta, 2) / 8, 0);
  complex<double> R = -Q / 2.0 + sqrt(pow(Q, 2.0) / 4.0 + pow(P, 3.0) / 27.0);

  complex<double> U = pow(R, (1.0 / 3.0));
  complex<double> y;

  if (U.real() == 0)
    y = -5.0 * alpha / 6.0 - pow(Q, (1.0 / 3.0));
  else
    y = -5.0 * alpha / 6.0 - P / (3.0 * U) + U;

  complex<double> w = sqrt(alpha + 2.0 * y);

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (w + sqrt(-(3.0 * alpha + 2.0 * y + 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (w - sqrt(-(3.0 * alpha + 2.0 * y + 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (-w + sqrt(-(3.0 * alpha + 2.0 * y - 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (-w - sqrt(-(3.0 * alpha + 2.0 * y - 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  return realRoots;
}